

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v7::detail::
arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
::char_spec_handler::on_char(char_spec_handler *this)

{
  char cVar1;
  arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
  *paVar2;
  buffer<char> *pbVar3;
  size_t sVar4;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar5;
  
  paVar2 = this->formatter;
  if (paVar2->specs_ == (basic_format_specs<char> *)0x0) {
    cVar1 = this->value;
    pbVar3 = (paVar2->out_).container;
    if (pbVar3->capacity_ < pbVar3->size_ + 1) {
      (**pbVar3->_vptr_buffer)(pbVar3);
    }
    sVar4 = pbVar3->size_;
    pbVar3->size_ = sVar4 + 1;
    pbVar3->ptr_[sVar4] = cVar1;
  }
  else {
    bVar5 = write_char<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                      ((paVar2->out_).container,this->value,paVar2->specs_);
    (this->formatter->out_).container = bVar5.container;
  }
  return;
}

Assistant:

void on_char() {
      if (formatter.specs_)
        formatter.out_ = write_char(formatter.out_, value, *formatter.specs_);
      else
        formatter.write(value);
    }